

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts5RowidFunction(sqlite3_context *pCtx,int nArg,sqlite3_value **apVal)

{
  int iVar1;
  uchar *zLeft;
  i64 iVar2;
  i64 iVar3;
  char *z;
  
  if (nArg == 0) {
    z = "should be: fts5_rowid(subject, ....)";
  }
  else {
    zLeft = sqlite3_value_text(*apVal);
    iVar1 = sqlite3_stricmp((char *)zLeft,"segment");
    if (iVar1 == 0) {
      if (nArg == 3) {
        iVar2 = sqlite3VdbeIntValue(apVal[1]);
        iVar3 = sqlite3VdbeIntValue(apVal[2]);
        sqlite3_result_int64(pCtx,(long)(int)iVar3 + (iVar2 << 0x25));
        return;
      }
      z = "should be: fts5_rowid(\'segment\', segid, pgno))";
    }
    else {
      z = "first arg to fts5_rowid() must be \'segment\'";
    }
  }
  sqlite3_result_error(pCtx,z,-1);
  return;
}

Assistant:

static void fts5RowidFunction(
  sqlite3_context *pCtx,          /* Function call context */
  int nArg,                       /* Number of args (always 2) */
  sqlite3_value **apVal           /* Function arguments */
){
  const char *zArg;
  if( nArg==0 ){
    sqlite3_result_error(pCtx, "should be: fts5_rowid(subject, ....)", -1);
  }else{
    zArg = (const char*)sqlite3_value_text(apVal[0]);
    if( 0==sqlite3_stricmp(zArg, "segment") ){
      i64 iRowid;
      int segid, pgno;
      if( nArg!=3 ){
        sqlite3_result_error(pCtx, 
            "should be: fts5_rowid('segment', segid, pgno))", -1
        );
      }else{
        segid = sqlite3_value_int(apVal[1]);
        pgno = sqlite3_value_int(apVal[2]);
        iRowid = FTS5_SEGMENT_ROWID(segid, pgno);
        sqlite3_result_int64(pCtx, iRowid);
      }
    }else{
      sqlite3_result_error(pCtx, 
        "first arg to fts5_rowid() must be 'segment'" , -1
      );
    }
  }
}